

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O0

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  char *in_RCX;
  long lVar10;
  long in_RDX;
  char *in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  bool bVar11;
  long in_stack_00000008;
  int *in_stack_00000010;
  ulong *in_stack_00000018;
  undefined4 *in_stack_00000020;
  long *in_stack_00000028;
  long *in_stack_00000030;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  int delayed_backward_references_in_row;
  uint8_t p2;
  uint8_t p1;
  int dict_id;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H40 *privat;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  uint32_t delta_4;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  uint32_t nbits_2;
  uint32_t offset_3;
  uint16_t bits64;
  int next_last_distance_1;
  int last_distance_1;
  int next_last_distance;
  int last_distance;
  size_t score_4;
  size_t len_3;
  size_t last_1;
  size_t prev_ix_3;
  size_t slot_1;
  size_t delta_2;
  size_t hops_1;
  size_t backward_4;
  size_t bank_2;
  size_t score_3;
  size_t len_2;
  size_t prev_ix_2;
  size_t backward_3;
  uint8_t tiny_hash_2;
  size_t key_3;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_1;
  BankH40 *banks_2;
  uint8_t *tiny_hashes_1;
  uint16_t *head_2;
  uint32_t *addr_2;
  size_t matching_bits_4;
  uint64_t x_4;
  uint8_t *s1_orig_4;
  size_t matching_bits_3;
  uint64_t x_3;
  uint8_t *s1_orig_3;
  int item_matches_1;
  size_t i_3;
  size_t key_5;
  uint64_t t_11;
  uint64_t t_10;
  uint64_t t_13;
  uint64_t t_12;
  uint32_t h_5;
  uint32_t t_15;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_5;
  size_t matchlen_1;
  size_t offset_1;
  size_t matching_bits_5;
  uint64_t x_5;
  uint8_t *s1_orig_5;
  uint64_t t_17;
  uint64_t t_16;
  size_t score_1;
  size_t len_1;
  size_t last;
  size_t prev_ix_1;
  size_t slot;
  size_t delta;
  size_t hops;
  size_t backward_1;
  size_t bank;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  uint8_t tiny_hash;
  size_t key;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  BankH40 *banks;
  uint8_t *tiny_hashes;
  uint16_t *head;
  uint32_t *addr;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  int item_matches;
  size_t i_1;
  size_t key_2;
  uint64_t t_2;
  uint64_t t_1;
  uint64_t t_4;
  uint64_t t_3;
  uint32_t h_2;
  uint32_t t_6;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_2;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_2;
  uint64_t x_2;
  uint8_t *s1_orig_2;
  uint64_t t_8;
  uint64_t t_7;
  size_t i_4;
  size_t delta_5;
  size_t idx_2;
  size_t bank_4;
  size_t key_6;
  BankH40 *banks_4;
  uint8_t *tiny_hash_4;
  uint16_t *head_4;
  uint32_t *addr_4;
  size_t delta_1;
  size_t idx;
  size_t bank_1;
  size_t key_1;
  BankH40 *banks_1;
  uint8_t *tiny_hash_1;
  uint16_t *head_1;
  uint32_t *addr_1;
  size_t delta_3;
  size_t idx_1;
  size_t bank_3;
  size_t key_4;
  BankH40 *banks_3;
  uint8_t *tiny_hash_3;
  uint16_t *head_3;
  uint32_t *addr_3;
  size_t delta_7;
  size_t idx_4;
  size_t bank_6;
  size_t key_8;
  BankH40 *banks_6;
  uint8_t *tiny_hash_6;
  uint16_t *head_6;
  uint32_t *addr_6;
  size_t delta_6;
  size_t idx_3;
  size_t bank_5;
  size_t key_7;
  BankH40 *banks_5;
  uint8_t *tiny_hash_5;
  uint16_t *head_5;
  uint32_t *addr_5;
  uint32_t h_7;
  uint32_t t_19;
  uint32_t h_8;
  uint32_t t_20;
  uint32_t h_4;
  uint32_t t_14;
  uint32_t h_1;
  uint32_t t_5;
  uint32_t h_6;
  uint32_t t_18;
  uint32_t h;
  uint32_t t;
  uint32_t h_3;
  uint32_t t_9;
  char *local_e00;
  char *local_df0;
  char *local_de0;
  char *local_dd8;
  char *local_dc8;
  char *local_db0;
  char *local_da0;
  char *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d30;
  char *local_d20;
  char *local_d18;
  ulong local_d10;
  undefined4 local_d08;
  undefined4 uStack_d04;
  undefined8 local_d00;
  int local_cf4;
  byte local_cee;
  byte local_ced;
  uint local_cec;
  char *local_ce8;
  char *local_ce0;
  ulong local_cd8;
  ulong local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  undefined8 local_cb0;
  long local_ca8;
  char *local_ca0;
  long local_c98;
  char *local_c90;
  char *local_c88;
  ulong local_c80;
  undefined4 *local_c78;
  long local_c70;
  char *local_c68;
  ushort *local_c60;
  long local_c58;
  long local_c50;
  char *local_c48;
  long local_c40;
  char *local_c38;
  char *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  ulong local_b80;
  ulong local_b78;
  char *local_b70;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  uint local_b44;
  char *local_b40;
  uint local_b34;
  char *local_b30;
  ulong local_b28;
  uint *local_b20;
  undefined4 *local_b18;
  undefined8 local_b10;
  undefined8 local_b08;
  undefined8 local_b00;
  undefined8 local_af8;
  char *local_af0;
  char *local_ae8;
  long local_ae0;
  long local_ad8;
  ulong local_ad0;
  ulong local_ac8;
  ulong local_ac0;
  ulong local_ab8;
  char *local_ab0;
  undefined4 *local_aa8;
  ushort *local_aa0;
  ulong local_a98;
  ulong local_a90;
  char *local_a88;
  char *local_a80;
  ushort local_a74;
  ushort local_a72;
  ushort *local_a70;
  uint local_a64;
  ulong local_a60;
  ulong local_a58;
  int local_a4c;
  ulong local_a48;
  ushort local_a3a;
  long local_a38;
  long local_a30;
  int local_a24;
  ulong local_a20;
  ushort local_a12;
  long local_a10;
  long local_a08;
  int local_9fc;
  ushort local_9f6;
  uint local_9f4;
  ushort local_9ee;
  ushort local_9ec;
  ushort local_9ea;
  ushort *local_9e0;
  undefined4 local_9cc;
  ushort *local_9b8;
  undefined4 local_9a4;
  char *local_998;
  char *local_990;
  ulong local_988;
  ulong local_980;
  ulong local_978;
  ulong local_970;
  long local_968;
  char *local_960;
  long local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  uint8_t local_929;
  ulong local_928;
  ulong local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  ulong local_900;
  BankH40 *local_8f8;
  uint8_t *local_8f0;
  uint16_t *local_8e8;
  uint32_t *local_8e0;
  char **local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  int *local_8a8;
  char *local_8a0;
  long local_898;
  long *local_890;
  ushort *local_888;
  ulong local_880;
  ulong local_878;
  ulong *local_870;
  char *local_868;
  ulong *local_860;
  ulong *local_858;
  char *local_850;
  ulong local_848;
  ulong local_840;
  ulong *local_838;
  char *local_830;
  ulong *local_828;
  ulong *local_820;
  char *local_818;
  char *local_810;
  ulong local_808;
  char *local_800;
  char *local_7f8;
  int local_7ec;
  ulong local_7e8;
  ulong local_7e0;
  int local_7d4;
  char **local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  ulong *local_7b0;
  long local_7a8;
  long *local_7a0;
  ulong local_798;
  ulong *local_790;
  ulong local_788;
  ulong *local_780;
  ulong local_778;
  ulong *local_770;
  ulong local_768;
  ulong *local_760;
  char *local_758;
  uint local_74c;
  ulong *local_748;
  int local_73c;
  ulong *local_738;
  long local_730;
  long local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  long local_708;
  char **local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  ulong *local_6e0;
  ulong local_6d8;
  char *local_6d0;
  long *local_6c8;
  int local_6bc;
  ulong local_6b8;
  ulong local_6b0;
  ulong *local_6a8;
  char *local_6a0;
  ulong *local_698;
  ulong *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  ulong local_670;
  ulong *local_668;
  ulong local_660;
  ulong *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  ulong local_638;
  ulong local_630;
  ulong local_628;
  ulong local_620;
  long local_618;
  char *local_610;
  long local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  uint8_t local_5d9;
  ulong local_5d8;
  ulong local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  ulong local_5b0;
  BankH40 *local_5a8;
  uint8_t *local_5a0;
  uint16_t *local_598;
  uint32_t *local_590;
  char **local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  int *local_558;
  char *local_550;
  long local_548;
  long *local_540;
  ushort *local_538;
  ulong local_530;
  ulong local_528;
  ulong *local_520;
  char *local_518;
  ulong *local_510;
  ulong *local_508;
  char *local_500;
  ulong local_4f8;
  ulong local_4f0;
  ulong *local_4e8;
  char *local_4e0;
  ulong *local_4d8;
  ulong *local_4d0;
  char *local_4c8;
  char *local_4c0;
  ulong local_4b8;
  char *local_4b0;
  char *local_4a8;
  int local_49c;
  ulong local_498;
  ulong local_490;
  int local_484;
  char **local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  ulong *local_460;
  long local_458;
  long *local_450;
  ulong local_448;
  ulong *local_440;
  ulong local_438;
  ulong *local_430;
  ulong local_428;
  ulong *local_420;
  ulong local_418;
  ulong *local_410;
  char *local_408;
  uint local_3fc;
  ulong *local_3f8;
  int local_3ec;
  ulong *local_3e8;
  long local_3e0;
  long local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  long local_3b8;
  char **local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  ulong *local_390;
  ulong local_388;
  char *local_380;
  long *local_378;
  int local_36c;
  ulong local_368;
  ulong local_360;
  ulong *local_358;
  char *local_350;
  ulong *local_348;
  ulong *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  ulong local_320;
  ulong *local_318;
  ulong local_310;
  ulong *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  long local_2d8;
  ushort *local_2d0;
  ulong local_2c8;
  long local_2c0;
  undefined8 local_2b8;
  ulong local_2b0;
  BankH40 *local_2a8;
  uint8_t *local_2a0;
  uint16_t *local_298;
  uint32_t *local_290;
  char *local_288;
  char *local_280;
  long local_278;
  ushort *local_270;
  ulong local_268;
  long local_260;
  undefined8 local_258;
  ulong local_250;
  BankH40 *local_248;
  uint8_t *local_240;
  uint16_t *local_238;
  uint32_t *local_230;
  char *local_228;
  char *local_220;
  long local_218;
  ushort *local_210;
  ulong local_208;
  long local_200;
  undefined8 local_1f8;
  ulong local_1f0;
  BankH40 *local_1e8;
  uint8_t *local_1e0;
  uint16_t *local_1d8;
  uint32_t *local_1d0;
  char *local_1c8;
  char *local_1c0;
  long local_1b8;
  ushort *local_1b0;
  ulong local_1a8;
  long local_1a0;
  undefined8 local_198;
  ulong local_190;
  BankH40 *local_188;
  uint8_t *local_180;
  uint16_t *local_178;
  uint32_t *local_170;
  char *local_168;
  char *local_160;
  long local_158;
  ushort *local_150;
  ulong local_148;
  long local_140;
  undefined8 local_138;
  ulong local_130;
  BankH40 *local_128;
  uint8_t *local_120;
  uint16_t *local_118;
  uint32_t *local_110;
  char *local_108;
  char *local_100;
  long local_f8;
  ushort *local_f0;
  uint local_e4;
  int *local_e0;
  int local_d4;
  int *local_d0;
  uint local_c4;
  int *local_c0;
  int local_b4;
  int *local_b0;
  uint local_a4;
  int *local_a0;
  int local_94;
  int *local_90;
  uint local_84;
  int *local_80;
  int local_74;
  int *local_70;
  uint local_64;
  int *local_60;
  int local_54;
  int *local_50;
  uint local_44;
  int *local_40;
  int local_34;
  int *local_30;
  uint local_24;
  int *local_20;
  int local_14;
  int *local_10;
  
  local_c60 = (ushort *)(in_stack_00000008 + 0x50);
  local_c68 = (char *)((1L << ((byte)*(undefined4 *)(in_R9 + 8) & 0x3f)) + -0x10);
  local_c70 = *(long *)(in_R9 + 0x10);
  local_c78 = in_stack_00000020;
  local_c80 = *in_stack_00000018;
  local_c88 = in_RSI + in_RDI;
  local_d60 = in_RSI;
  if (3 < in_RDI) {
    local_d60 = in_RSI + (in_RDI - 3);
  }
  local_c90 = local_d60;
  iVar4 = 0x200;
  if (*(int *)(in_R9 + 4) < 9) {
    iVar4 = 0x40;
  }
  local_c98 = (long)iVar4;
  local_ca0 = in_RSI + local_c98;
  local_ca8 = *(long *)(in_R9 + 0x60);
  local_cb0 = 0x7e4;
  local_9a4 = 4;
  local_c58 = in_R9;
  local_c50 = in_R8;
  local_c48 = in_RCX;
  local_c40 = in_RDX;
  pcVar6 = in_RSI;
  local_9b8 = local_c60;
LAB_007d5810:
  do {
    local_c38 = pcVar6;
    if (local_c88 <= local_c38 + 4) {
      *in_stack_00000018 = (ulong)(local_c88 + (local_c80 - (long)local_c38));
      *in_stack_00000028 = ((long)in_stack_00000020 - (long)local_c78 >> 4) + *in_stack_00000028;
      return;
    }
    local_cb8 = local_c88 + -(long)local_c38;
    local_b88 = local_c38;
    local_b90 = local_c68;
    if (local_c38 < local_c68) {
      local_d68 = local_c38;
    }
    else {
      local_d68 = local_c68;
    }
    local_cc0 = local_d68;
    local_b98 = local_c38 + local_c70;
    local_ba0 = local_c68;
    local_d70 = local_b98;
    if (local_c68 <= local_b98) {
      local_d70 = local_c68;
    }
    local_cc8 = local_d70;
    local_cec = 0;
    local_ced = 0;
    local_cee = 0;
    if (*(int *)(local_c58 + 0x270) != 0) {
      if (local_c38 == (char *)0x0) {
        local_ced = 0;
      }
      else {
        local_ced = *(byte *)(local_c40 + ((ulong)(local_c38 + -1) & (ulong)local_c48));
      }
      if (local_c38 < (char *)0x2) {
        local_cee = 0;
      }
      else {
        local_cee = *(byte *)(local_c40 + ((ulong)(local_c38 + -2) & (ulong)local_c48));
      }
      local_cec = (uint)*(byte *)(local_c58 + 0x275 +
                                 (long)(int)(uint)(*(byte *)(local_c50 + (ulong)local_ced) |
                                                  *(byte *)(local_c50 + 0x100 + (ulong)local_cee)));
    }
    local_ce8 = (char *)0x0;
    local_cd0 = local_cd0 & 0xffffffff00000000;
    local_ce0 = (char *)0x0;
    local_cd8 = 0x7e4;
    local_540 = *(long **)(local_c58 + 0x2b8 + (long)(int)local_cec * 8);
    local_578 = local_d70 + local_ca8;
    local_580 = *(char **)(local_c58 + 0x48);
    local_538 = local_c60;
    local_548 = local_c40;
    local_550 = local_c48;
    local_558 = in_stack_00000010;
    local_560 = local_c38;
    local_570 = local_d68;
    local_588 = &local_ce8;
    local_568 = local_cb8;
    local_590 = duckdb_brotli::AddrH40(*(void **)(local_c60 + 8));
    local_598 = duckdb_brotli::HeadH40((void *)0x7d5b49);
    local_5a0 = duckdb_brotli::TinyHashH40((void *)0x7d5b62);
    local_5a8 = duckdb_brotli::BanksH40(*(void **)(local_538 + 0xc));
    local_5b0 = (ulong)local_560 & (ulong)local_550;
    local_5b8 = local_588[2];
    local_5c0 = local_588[2];
    local_5c8 = *local_588;
    local_40 = (int *)(local_548 + local_5b0);
    local_34 = *local_40;
    local_44 = local_34 * 0x1e35a7bd;
    local_5d8 = (ulong)(local_44 >> 0x11);
    local_5d9 = (uint8_t)(local_44 >> 0x11);
    local_30 = local_40;
    *local_588 = (char *)0x0;
    *(undefined4 *)(local_588 + 3) = 0;
    for (local_5d0 = 0; local_5d0 < 4; local_5d0 = local_5d0 + 1) {
      local_5e8 = (char *)(long)local_558[local_5d0];
      local_5f0 = local_560 + -(long)local_5e8;
      if ((((local_5d0 == 0) || (local_5a0[(ulong)local_5f0 & 0xffff] == local_5d9)) &&
          (local_5f0 < local_560)) && (local_5e8 <= local_570)) {
        local_5f0 = (char *)((ulong)local_550 & (ulong)local_5f0);
        local_4e8 = (ulong *)(local_5f0 + local_548);
        local_4d8 = (ulong *)(local_548 + local_5b0);
        local_4e0 = local_568;
        local_4d0 = local_4e8;
LAB_007d5d75:
        if (local_4e0 < (char *)0x8) {
          while( true ) {
            bVar11 = false;
            if (local_4e0 != (char *)0x0) {
              bVar11 = (char)*local_4d0 == (char)*local_4d8;
            }
            if (!bVar11) break;
            local_4e0 = local_4e0 + -1;
            local_4d8 = (ulong *)((long)local_4d8 + 1);
            local_4d0 = (ulong *)((long)local_4d0 + 1);
          }
          local_4c8 = (char *)((long)local_4d0 - (long)local_4e8);
        }
        else {
          local_430 = local_4d8;
          local_438 = *local_4d8;
          local_440 = local_4d0;
          local_448 = *local_4d0;
          local_4f0 = local_438 ^ local_448;
          local_4d8 = local_4d8 + 1;
          if (local_4f0 == 0) goto LAB_007d5e47;
          iVar4 = 0;
          for (uVar5 = local_4f0; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_4f8 = (ulong)iVar4;
          local_4c8 = (char *)((long)local_4d0 + ((local_4f8 >> 3) - (long)local_4e8));
        }
        local_5f8 = local_4c8;
        if ((char *)0x1 < local_4c8) {
          local_4c0 = local_4c8;
          local_600 = (char *)((long)local_4c8 * 0x87 + 0x78f);
          if (local_5c0 < local_600) {
            if (local_5d0 != 0) {
              local_4b8 = local_5d0;
              local_600 = local_600 +
                          -((long)(int)(0x1ca10 >> ((byte)local_5d0 & 0xe) & 0xe) + 0x27);
            }
            if (local_5c0 < local_600) {
              local_5c0 = local_600;
              local_5c8 = local_4c8;
              *local_588 = local_4c8;
              local_588[1] = local_5e8;
              local_588[2] = local_5c0;
            }
          }
        }
      }
    }
    local_608 = 0;
    local_610 = (char *)0x0;
    local_620 = (long)local_560 - (ulong)local_590[local_5d8];
    local_628 = (ulong)local_598[local_5d8];
    local_618 = *(long *)(local_538 + 4);
    while (lVar10 = local_618 + -1, local_618 != 0) {
      local_638 = local_628;
      local_610 = local_610 + local_620;
      if (local_570 < local_610) break;
      local_630 = (long)local_560 - (long)local_610 & (ulong)local_550;
      uVar5 = (ulong)local_5a8[local_608].slots[local_628].next;
      local_620 = (ulong)local_5a8[local_608].slots[local_628].delta;
      local_628 = uVar5;
      local_618 = lVar10;
      if (((local_5c8 + local_5b0 <= local_550) && (local_5c8 + local_630 <= local_550)) &&
         (local_5c8[local_548 + local_5b0] == local_5c8[local_548 + local_630])) {
        local_520 = (ulong *)(local_548 + local_630);
        local_510 = (ulong *)(local_548 + local_5b0);
        local_518 = local_568;
        local_508 = local_520;
LAB_007d625b:
        if (local_518 < (char *)0x8) {
          while( true ) {
            bVar11 = false;
            if (local_518 != (char *)0x0) {
              bVar11 = (char)*local_508 == (char)*local_510;
            }
            if (!bVar11) break;
            local_518 = local_518 + -1;
            local_510 = (ulong *)((long)local_510 + 1);
            local_508 = (ulong *)((long)local_508 + 1);
          }
          local_500 = (char *)((long)local_508 - (long)local_520);
        }
        else {
          local_410 = local_510;
          local_418 = *local_510;
          local_420 = local_508;
          local_428 = *local_508;
          local_528 = local_418 ^ local_428;
          local_510 = local_510 + 1;
          if (local_528 == 0) goto LAB_007d632d;
          iVar4 = 0;
          for (uVar5 = local_528; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_530 = (ulong)iVar4;
          local_500 = (char *)((long)local_508 + ((local_530 >> 3) - (long)local_520));
        }
        local_640 = local_500;
        if ((char *)0x3 < local_500) {
          local_4a8 = local_500;
          iVar4 = 0x1f;
          if ((uint)local_610 != 0) {
            for (; (uint)local_610 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          local_648 = (char *)(((long)local_500 * 0x87 + 0x780) - (ulong)(uint)(iVar4 * 0x1e));
          local_4b0 = local_610;
          local_408 = local_610;
          if (local_5c0 < local_648) {
            local_5c8 = local_500;
            local_5c0 = local_648;
            *local_588 = local_500;
            local_588[1] = local_610;
            local_588[2] = local_5c0;
          }
        }
      }
    }
    local_210 = local_538;
    local_218 = local_548;
    local_220 = local_550;
    local_228 = local_560;
    local_618 = lVar10;
    local_230 = duckdb_brotli::AddrH40(*(void **)(local_538 + 8));
    local_238 = duckdb_brotli::HeadH40((void *)0x7d655b);
    local_240 = duckdb_brotli::TinyHashH40((void *)0x7d6574);
    local_248 = duckdb_brotli::BanksH40(*(void **)(local_210 + 0xc));
    local_80 = (int *)(local_218 + ((ulong)local_228 & (ulong)local_220));
    local_74 = *local_80;
    local_84 = local_74 * 0x1e35a7bd;
    local_250 = (ulong)(local_84 >> 0x11);
    local_258 = 0;
    uVar2 = *local_210;
    *local_210 = uVar2 + 1;
    local_260 = (long)(int)(uint)uVar2;
    local_268 = (long)local_228 - (ulong)local_230[local_250];
    local_240[(ulong)local_228 & 0xffff] = (uint8_t)(local_84 >> 0x11);
    if (0xffff < local_268) {
      local_268 = 0xffff;
    }
    local_248->slots[local_260].delta = (uint16_t)local_268;
    local_248->slots[local_260].next = local_238[local_250];
    local_230[local_250] = (uint32_t)local_228;
    local_238[local_250] = uVar2;
    local_70 = local_80;
    if (local_588[2] == local_5b8) {
      local_458 = *(long *)(local_538 + 0x10);
      local_460 = (ulong *)(local_548 + local_5b0);
      local_450 = local_540;
      local_468 = local_568;
      local_470 = local_578;
      local_478 = local_580;
      local_480 = local_588;
      local_484 = 0;
      if (*(ulong *)(local_458 + 0x28) >> 7 <= *(ulong *)(local_458 + 0x30)) {
        local_3ec = (int)*local_460;
        local_3fc = local_3ec * 0x1e35a7bd;
        local_490 = (ulong)((local_3fc >> 0x12) << 1);
        local_498 = 0;
        local_3f8 = local_460;
        local_3e8 = local_460;
        while( true ) {
          uVar9 = 2;
          if (local_484 != 0) {
            uVar9 = 1;
          }
          if (uVar9 <= local_498) break;
          *(long *)(local_458 + 0x28) = *(long *)(local_458 + 0x28) + 1;
          if (*(char *)(local_450[4] + local_490) != '\0') {
            local_380 = (char *)(ulong)*(byte *)(local_450[4] + local_490);
            local_388 = (ulong)*(ushort *)(local_450[3] + local_490 * 2);
            local_378 = local_450;
            local_390 = local_460;
            local_398 = local_468;
            local_3a0 = local_470;
            local_3a8 = local_478;
            local_3b0 = local_480;
            local_3b8 = (ulong)*(uint *)(*local_450 + 0x20 + (long)local_380 * 4) +
                        (long)local_380 * local_388;
            if (local_468 < local_380) {
              local_36c = 0;
            }
            else {
              local_348 = (ulong *)(*(long *)(*local_450 + 0xa8) + local_3b8);
              local_340 = local_460;
              local_358 = local_460;
              local_350 = local_380;
LAB_007d6a16:
              if (local_350 < (char *)0x8) {
                while( true ) {
                  bVar11 = false;
                  if (local_350 != (char *)0x0) {
                    bVar11 = (char)*local_340 == (char)*local_348;
                  }
                  if (!bVar11) break;
                  local_350 = local_350 + -1;
                  local_348 = (ulong *)((long)local_348 + 1);
                  local_340 = (ulong *)((long)local_340 + 1);
                }
                local_338 = (char *)((long)local_340 - (long)local_460);
              }
              else {
                local_308 = local_348;
                local_310 = *local_348;
                local_318 = local_340;
                local_320 = *local_340;
                local_360 = local_310 ^ local_320;
                local_348 = local_348 + 1;
                if (local_360 == 0) goto LAB_007d6ae8;
                iVar4 = 0;
                for (uVar5 = local_360; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                  iVar4 = iVar4 + 1;
                }
                local_368 = (ulong)iVar4;
                local_338 = (char *)((long)local_340 + ((local_368 >> 3) - (long)local_460));
              }
              local_3c0 = local_338;
              if ((local_380 < local_338 + *(uint *)((long)local_450 + 0xc)) &&
                 (local_338 != (char *)0x0)) {
                local_3d8 = (long)local_380 - (long)local_338;
                local_3e0 = local_3d8 * 4 +
                            ((ulong)local_450[2] >> ((char)local_3d8 * '\x06' & 0x3fU) & 0x3f);
                local_3c8 = local_470 +
                            (local_3e0 << (local_380[*local_450] & 0x3fU)) + local_388 + 1;
                if (local_478 < local_3c8) {
                  local_36c = 0;
                }
                else {
                  local_328 = local_338;
                  iVar4 = 0x1f;
                  if ((uint)local_3c8 != 0) {
                    for (; (uint)local_3c8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                    }
                  }
                  local_3d0 = (char *)(((long)local_338 * 0x87 + 0x780) -
                                      (ulong)(uint)(iVar4 * 0x1e));
                  local_330 = local_3c8;
                  local_300 = local_3c8;
                  if (local_3d0 < local_480[2]) {
                    local_36c = 0;
                  }
                  else {
                    *local_480 = local_338;
                    *(int *)(local_3b0 + 3) = (int)local_380 - (int)local_3c0;
                    local_3b0[1] = local_3c8;
                    local_3b0[2] = local_3d0;
                    local_36c = 1;
                  }
                }
              }
              else {
                local_36c = 0;
              }
            }
            local_49c = local_36c;
            if (local_36c != 0) {
              *(long *)(local_458 + 0x30) = *(long *)(local_458 + 0x30) + 1;
            }
          }
          local_498 = local_498 + 1;
          local_490 = local_490 + 1;
        }
      }
    }
    if (0x7e4 < local_cd8) {
      local_cf4 = 0;
      do {
        local_cb8 = local_cb8 + -1;
        local_d00 = 0xaf;
        if (*(int *)(local_c58 + 4) < 5) {
          local_ba8 = local_ce8 + -1;
          local_bb0 = local_cb8;
          local_d88 = local_ba8;
          if (local_cb8 <= local_ba8) {
            local_d88 = local_cb8;
          }
          local_d90 = local_d88;
        }
        else {
          local_d90 = (char *)0x0;
        }
        local_d20 = local_d90;
        local_d08 = 0;
        local_d18 = (char *)0x0;
        local_d10 = 0x7e4;
        local_bb8 = local_c38 + 1;
        local_bc0 = local_c68;
        local_d98 = local_bb8;
        if (local_c68 <= local_bb8) {
          local_d98 = local_c68;
        }
        local_cc0 = local_d98;
        local_bc8 = local_c38 + local_c70 + 1;
        local_bd0 = local_c68;
        local_da0 = local_bc8;
        if (local_c68 <= local_bc8) {
          local_da0 = local_c68;
        }
        local_cc8 = local_da0;
        if (*(int *)(local_c58 + 0x270) != 0) {
          local_cee = local_ced;
          bVar1 = *(byte *)(local_c40 + ((ulong)local_c38 & (ulong)local_c48));
          local_cec = (uint)*(byte *)(local_c58 + 0x275 +
                                     (long)(int)(uint)(*(byte *)(local_c50 + (ulong)bVar1) |
                                                      *(byte *)(local_c50 + 0x100 + (ulong)local_ced
                                                               )));
          local_ced = bVar1;
        }
        local_890 = *(long **)(local_c58 + 0x2b8 + (long)(int)local_cec * 8);
        local_8b0 = local_c38 + 1;
        local_8c8 = local_da0 + local_ca8;
        local_8d0 = *(char **)(local_c58 + 0x48);
        local_888 = local_c60;
        local_898 = local_c40;
        local_8a0 = local_c48;
        local_8a8 = in_stack_00000010;
        local_8b8 = local_cb8;
        local_8c0 = local_d98;
        local_8d8 = &local_d20;
        local_8e0 = duckdb_brotli::AddrH40(*(void **)(local_c60 + 8));
        local_8e8 = duckdb_brotli::HeadH40((void *)0x7d7133);
        local_8f0 = duckdb_brotli::TinyHashH40((void *)0x7d714c);
        local_8f8 = duckdb_brotli::BanksH40(*(void **)(local_888 + 0xc));
        local_900 = (ulong)local_8b0 & (ulong)local_8a0;
        local_908 = local_8d8[2];
        local_910 = local_8d8[2];
        local_918 = *local_8d8;
        local_20 = (int *)(local_898 + local_900);
        local_14 = *local_20;
        local_24 = local_14 * 0x1e35a7bd;
        local_928 = (ulong)(local_24 >> 0x11);
        local_929 = (uint8_t)(local_24 >> 0x11);
        local_10 = local_20;
        *local_8d8 = (char *)0x0;
        *(undefined4 *)(local_8d8 + 3) = 0;
        for (local_920 = 0; local_920 < 4; local_920 = local_920 + 1) {
          local_938 = (char *)(long)local_8a8[local_920];
          local_940 = local_8b0 + -(long)local_938;
          if ((((local_920 == 0) || (local_8f0[(ulong)local_940 & 0xffff] == local_929)) &&
              (local_940 < local_8b0)) && (local_938 <= local_8c0)) {
            local_940 = (char *)((ulong)local_8a0 & (ulong)local_940);
            local_838 = (ulong *)(local_940 + local_898);
            local_828 = (ulong *)(local_898 + local_900);
            local_830 = local_8b8;
            local_820 = local_838;
LAB_007d735f:
            if (local_830 < (char *)0x8) {
              while( true ) {
                bVar11 = false;
                if (local_830 != (char *)0x0) {
                  bVar11 = (char)*local_820 == (char)*local_828;
                }
                if (!bVar11) break;
                local_830 = local_830 + -1;
                local_828 = (ulong *)((long)local_828 + 1);
                local_820 = (ulong *)((long)local_820 + 1);
              }
              local_818 = (char *)((long)local_820 - (long)local_838);
            }
            else {
              local_780 = local_828;
              local_788 = *local_828;
              local_790 = local_820;
              local_798 = *local_820;
              local_840 = local_788 ^ local_798;
              local_828 = local_828 + 1;
              if (local_840 == 0) goto LAB_007d7431;
              iVar4 = 0;
              for (uVar5 = local_840; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                iVar4 = iVar4 + 1;
              }
              local_848 = (ulong)iVar4;
              local_818 = (char *)((long)local_820 + ((local_848 >> 3) - (long)local_838));
            }
            local_948 = local_818;
            if ((char *)0x1 < local_818) {
              local_810 = local_818;
              local_950 = (char *)((long)local_818 * 0x87 + 0x78f);
              if (local_910 < local_950) {
                if (local_920 != 0) {
                  local_808 = local_920;
                  local_950 = local_950 +
                              -((long)(int)(0x1ca10 >> ((byte)local_920 & 0xe) & 0xe) + 0x27);
                }
                if (local_910 < local_950) {
                  local_910 = local_950;
                  local_918 = local_818;
                  *local_8d8 = local_818;
                  local_8d8[1] = local_938;
                  local_8d8[2] = local_910;
                }
              }
            }
          }
        }
        local_958 = 0;
        local_960 = (char *)0x0;
        local_970 = (long)local_8b0 - (ulong)local_8e0[local_928];
        local_978 = (ulong)local_8e8[local_928];
        local_968 = *(long *)(local_888 + 4);
        while (lVar10 = local_968 + -1, local_968 != 0) {
          local_988 = local_978;
          local_960 = local_960 + local_970;
          if (local_8c0 < local_960) break;
          local_980 = (long)local_8b0 - (long)local_960 & (ulong)local_8a0;
          uVar5 = (ulong)local_8f8[local_958].slots[local_978].next;
          local_970 = (ulong)local_8f8[local_958].slots[local_978].delta;
          local_978 = uVar5;
          local_968 = lVar10;
          if (((local_918 + local_900 <= local_8a0) && (local_918 + local_980 <= local_8a0)) &&
             (local_918[local_898 + local_900] == local_918[local_898 + local_980])) {
            local_870 = (ulong *)(local_898 + local_980);
            local_860 = (ulong *)(local_898 + local_900);
            local_868 = local_8b8;
            local_858 = local_870;
LAB_007d7839:
            if (local_868 < (char *)0x8) {
              while( true ) {
                bVar11 = false;
                if (local_868 != (char *)0x0) {
                  bVar11 = (char)*local_858 == (char)*local_860;
                }
                if (!bVar11) break;
                local_868 = local_868 + -1;
                local_860 = (ulong *)((long)local_860 + 1);
                local_858 = (ulong *)((long)local_858 + 1);
              }
              local_850 = (char *)((long)local_858 - (long)local_870);
            }
            else {
              local_760 = local_860;
              local_768 = *local_860;
              local_770 = local_858;
              local_778 = *local_858;
              local_878 = local_768 ^ local_778;
              local_860 = local_860 + 1;
              if (local_878 == 0) goto LAB_007d790b;
              iVar4 = 0;
              for (uVar5 = local_878; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                iVar4 = iVar4 + 1;
              }
              local_880 = (ulong)iVar4;
              local_850 = (char *)((long)local_858 + ((local_880 >> 3) - (long)local_870));
            }
            local_990 = local_850;
            if ((char *)0x3 < local_850) {
              local_7f8 = local_850;
              iVar4 = 0x1f;
              if ((uint)local_960 != 0) {
                for (; (uint)local_960 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              local_998 = (char *)(((long)local_850 * 0x87 + 0x780) - (ulong)(uint)(iVar4 * 0x1e));
              local_800 = local_960;
              local_758 = local_960;
              if (local_910 < local_998) {
                local_918 = local_850;
                local_910 = local_998;
                *local_8d8 = local_850;
                local_8d8[1] = local_960;
                local_8d8[2] = local_910;
              }
            }
          }
        }
        local_1b0 = local_888;
        local_1b8 = local_898;
        local_1c0 = local_8a0;
        local_1c8 = local_8b0;
        local_968 = lVar10;
        local_1d0 = duckdb_brotli::AddrH40(*(void **)(local_888 + 8));
        local_1d8 = duckdb_brotli::HeadH40((void *)0x7d7b2d);
        local_1e0 = duckdb_brotli::TinyHashH40((void *)0x7d7b46);
        local_1e8 = duckdb_brotli::BanksH40(*(void **)(local_1b0 + 0xc));
        local_a0 = (int *)(local_1b8 + ((ulong)local_1c8 & (ulong)local_1c0));
        local_94 = *local_a0;
        local_a4 = local_94 * 0x1e35a7bd;
        local_1f0 = (ulong)(local_a4 >> 0x11);
        local_1f8 = 0;
        uVar2 = *local_1b0;
        *local_1b0 = uVar2 + 1;
        local_200 = (long)(int)(uint)uVar2;
        local_208 = (long)local_1c8 - (ulong)local_1d0[local_1f0];
        local_1e0[(ulong)local_1c8 & 0xffff] = (uint8_t)(local_a4 >> 0x11);
        if (0xffff < local_208) {
          local_208 = 0xffff;
        }
        local_1e8->slots[local_200].delta = (uint16_t)local_208;
        local_1e8->slots[local_200].next = local_1d8[local_1f0];
        local_1d0[local_1f0] = (uint32_t)local_1c8;
        local_1d8[local_1f0] = uVar2;
        local_90 = local_a0;
        if (local_8d8[2] == local_908) {
          local_7a8 = *(long *)(local_888 + 0x10);
          local_7b0 = (ulong *)(local_898 + local_900);
          local_7a0 = local_890;
          local_7b8 = local_8b8;
          local_7c0 = local_8c8;
          local_7c8 = local_8d0;
          local_7d0 = local_8d8;
          local_7d4 = 0;
          if (*(ulong *)(local_7a8 + 0x28) >> 7 <= *(ulong *)(local_7a8 + 0x30)) {
            local_73c = (int)*local_7b0;
            local_74c = local_73c * 0x1e35a7bd;
            local_7e0 = (ulong)((local_74c >> 0x12) << 1);
            local_7e8 = 0;
            local_748 = local_7b0;
            local_738 = local_7b0;
            while( true ) {
              uVar9 = 2;
              if (local_7d4 != 0) {
                uVar9 = 1;
              }
              if (uVar9 <= local_7e8) break;
              *(long *)(local_7a8 + 0x28) = *(long *)(local_7a8 + 0x28) + 1;
              if (*(char *)(local_7a0[4] + local_7e0) != '\0') {
                local_6d0 = (char *)(ulong)*(byte *)(local_7a0[4] + local_7e0);
                local_6d8 = (ulong)*(ushort *)(local_7a0[3] + local_7e0 * 2);
                local_6c8 = local_7a0;
                local_6e0 = local_7b0;
                local_6e8 = local_7b8;
                local_6f0 = local_7c0;
                local_6f8 = local_7c8;
                local_700 = local_7d0;
                local_708 = (ulong)*(uint *)(*local_7a0 + 0x20 + (long)local_6d0 * 4) +
                            (long)local_6d0 * local_6d8;
                if (local_7b8 < local_6d0) {
                  local_6bc = 0;
                }
                else {
                  local_698 = (ulong *)(*(long *)(*local_7a0 + 0xa8) + local_708);
                  local_690 = local_7b0;
                  local_6a8 = local_7b0;
                  local_6a0 = local_6d0;
LAB_007d7fe8:
                  if (local_6a0 < (char *)0x8) {
                    while( true ) {
                      bVar11 = false;
                      if (local_6a0 != (char *)0x0) {
                        bVar11 = (char)*local_690 == (char)*local_698;
                      }
                      if (!bVar11) break;
                      local_6a0 = local_6a0 + -1;
                      local_698 = (ulong *)((long)local_698 + 1);
                      local_690 = (ulong *)((long)local_690 + 1);
                    }
                    local_688 = (char *)((long)local_690 - (long)local_7b0);
                  }
                  else {
                    local_658 = local_698;
                    local_660 = *local_698;
                    local_668 = local_690;
                    local_670 = *local_690;
                    local_6b0 = local_660 ^ local_670;
                    local_698 = local_698 + 1;
                    if (local_6b0 == 0) goto LAB_007d80ba;
                    iVar4 = 0;
                    for (uVar5 = local_6b0; (uVar5 & 1) == 0;
                        uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                      iVar4 = iVar4 + 1;
                    }
                    local_6b8 = (ulong)iVar4;
                    local_688 = (char *)((long)local_690 + ((local_6b8 >> 3) - (long)local_7b0));
                  }
                  local_710 = local_688;
                  if ((local_6d0 < local_688 + *(uint *)((long)local_7a0 + 0xc)) &&
                     (local_688 != (char *)0x0)) {
                    local_728 = (long)local_6d0 - (long)local_688;
                    local_730 = local_728 * 4 +
                                ((ulong)local_7a0[2] >> ((char)local_728 * '\x06' & 0x3fU) & 0x3f);
                    local_718 = local_7c0 +
                                (local_730 << (local_6d0[*local_7a0] & 0x3fU)) + local_6d8 + 1;
                    if (local_7c8 < local_718) {
                      local_6bc = 0;
                    }
                    else {
                      local_678 = local_688;
                      iVar4 = 0x1f;
                      if ((uint)local_718 != 0) {
                        for (; (uint)local_718 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                        }
                      }
                      local_720 = (char *)(((long)local_688 * 0x87 + 0x780) -
                                          (ulong)(uint)(iVar4 * 0x1e));
                      local_680 = local_718;
                      local_650 = local_718;
                      if (local_720 < local_7d0[2]) {
                        local_6bc = 0;
                      }
                      else {
                        *local_7d0 = local_688;
                        *(int *)(local_700 + 3) = (int)local_6d0 - (int)local_710;
                        local_700[1] = local_718;
                        local_700[2] = local_720;
                        local_6bc = 1;
                      }
                    }
                  }
                  else {
                    local_6bc = 0;
                  }
                }
                local_7ec = local_6bc;
                if (local_6bc != 0) {
                  *(long *)(local_7a8 + 0x30) = *(long *)(local_7a8 + 0x30) + 1;
                }
              }
              local_7e8 = local_7e8 + 1;
              local_7e0 = local_7e0 + 1;
            }
          }
        }
        pcVar6 = local_c38;
        if (local_d10 < local_cd8 + 0xaf) goto LAB_007d847d;
        pcVar6 = local_c38 + 1;
        local_c80 = local_c80 + 1;
        local_ce8 = local_d20;
        local_ce0 = local_d18;
        local_cd8 = local_d10;
        local_cd0 = CONCAT44(uStack_d04,local_d08);
        local_cf4 = local_cf4 + 1;
        if ((3 < local_cf4) || (pcVar7 = local_c38 + 5, local_c38 = pcVar6, local_c88 <= pcVar7))
        goto LAB_007d847d;
      } while( true );
    }
    local_c80 = local_c80 + 1;
    pcVar6 = local_c38 + 1;
    if (local_ca0 < pcVar6) {
      if (local_ca0 + local_c98 * 4 < pcVar6) {
        local_af8 = 3;
        local_b00 = 4;
        local_c08 = local_c38 + 0x11;
        local_c10 = local_c88 + -4;
        local_c38 = pcVar6;
        local_df0 = local_c10;
        if (local_c08 < local_c10) {
          local_df0 = local_c08;
        }
        for (; pcVar6 = local_c38, local_c38 < local_df0; local_c38 = local_c38 + 4) {
          local_f0 = local_c60;
          local_f8 = local_c40;
          local_100 = local_c48;
          local_108 = local_c38;
          local_110 = duckdb_brotli::AddrH40(*(void **)(local_c60 + 8));
          local_118 = duckdb_brotli::HeadH40((void *)0x7d9594);
          local_120 = duckdb_brotli::TinyHashH40((void *)0x7d95ad);
          local_128 = duckdb_brotli::BanksH40(*(void **)(local_f0 + 0xc));
          local_e0 = (int *)(local_f8 + ((ulong)local_108 & (ulong)local_100));
          local_d4 = *local_e0;
          local_e4 = local_d4 * 0x1e35a7bd;
          local_130 = (ulong)(local_e4 >> 0x11);
          local_138 = 0;
          uVar2 = *local_f0;
          *local_f0 = uVar2 + 1;
          local_140 = (long)(int)(uint)uVar2;
          local_148 = (long)local_108 - (ulong)local_110[local_130];
          local_120[(ulong)local_108 & 0xffff] = (uint8_t)(local_e4 >> 0x11);
          if (0xffff < local_148) {
            local_148 = 0xffff;
          }
          local_128->slots[local_140].delta = (uint16_t)local_148;
          local_128->slots[local_140].next = local_118[local_130];
          local_110[local_130] = (uint32_t)local_108;
          local_118[local_130] = uVar2;
          local_c80 = local_c80 + 4;
          local_d0 = local_e0;
        }
      }
      else {
        local_b08 = 3;
        local_b10 = 2;
        local_c18 = local_c38 + 9;
        local_c20 = local_c88 + -3;
        local_c38 = pcVar6;
        local_e00 = local_c20;
        if (local_c18 < local_c20) {
          local_e00 = local_c18;
        }
        for (; pcVar6 = local_c38, local_c38 < local_e00; local_c38 = local_c38 + 2) {
          local_150 = local_c60;
          local_158 = local_c40;
          local_160 = local_c48;
          local_168 = local_c38;
          local_170 = duckdb_brotli::AddrH40(*(void **)(local_c60 + 8));
          local_178 = duckdb_brotli::HeadH40((void *)0x7d98e8);
          local_180 = duckdb_brotli::TinyHashH40((void *)0x7d9901);
          local_188 = duckdb_brotli::BanksH40(*(void **)(local_150 + 0xc));
          local_c0 = (int *)(local_158 + ((ulong)local_168 & (ulong)local_160));
          local_b4 = *local_c0;
          local_c4 = local_b4 * 0x1e35a7bd;
          local_190 = (ulong)(local_c4 >> 0x11);
          local_198 = 0;
          uVar2 = *local_150;
          *local_150 = uVar2 + 1;
          local_1a0 = (long)(int)(uint)uVar2;
          local_1a8 = (long)local_168 - (ulong)local_170[local_190];
          local_180[(ulong)local_168 & 0xffff] = (uint8_t)(local_c4 >> 0x11);
          if (0xffff < local_1a8) {
            local_1a8 = 0xffff;
          }
          local_188->slots[local_1a0].delta = (uint16_t)local_1a8;
          local_188->slots[local_1a0].next = local_178[local_190];
          local_170[local_190] = (uint32_t)local_168;
          local_178[local_190] = uVar2;
          local_c80 = local_c80 + 2;
          local_b0 = local_c0;
        }
      }
    }
  } while( true );
LAB_007d5e47:
  local_4d0 = local_4d0 + 1;
  local_4e0 = local_4e0 + -8;
  goto LAB_007d5d75;
LAB_007d632d:
  local_508 = local_508 + 1;
  local_518 = local_518 + -8;
  goto LAB_007d625b;
LAB_007d6ae8:
  local_340 = local_340 + 1;
  local_350 = local_350 + -8;
  goto LAB_007d6a16;
LAB_007d7431:
  local_820 = local_820 + 1;
  local_830 = local_830 + -8;
  goto LAB_007d735f;
LAB_007d790b:
  local_858 = local_858 + 1;
  local_868 = local_868 + -8;
  goto LAB_007d7839;
LAB_007d80ba:
  local_690 = local_690 + 1;
  local_6a0 = local_6a0 + -8;
  goto LAB_007d7fe8;
LAB_007d847d:
  local_c38 = pcVar6;
  local_ca0 = local_c38 + local_c98 + (long)local_ce8 * 2;
  local_bd8 = local_c38 + local_c70;
  local_be0 = local_c68;
  local_db0 = local_bd8;
  if (local_c68 <= local_bd8) {
    local_db0 = local_c68;
  }
  local_cc8 = local_db0;
  local_b60 = local_db0 + local_ca8;
  local_b58 = local_ce0;
  if (local_ce0 <= local_b60) {
    local_b70 = local_ce0 + 3;
    local_b78 = (long)local_b70 - (long)*in_stack_00000010;
    local_b80 = (long)local_b70 - (long)in_stack_00000010[1];
    if (local_ce0 == (char *)(long)*in_stack_00000010) {
      local_b50 = (char *)0x0;
      goto LAB_007d86dc;
    }
    if (local_ce0 == (char *)(long)in_stack_00000010[1]) {
      local_b50 = (char *)0x1;
      goto LAB_007d86dc;
    }
    if (local_b78 < 7) {
      local_b50 = (char *)(long)(int)(0x9750468 >> ((byte)((local_b78 & 0x3fffffff) << 2) & 0x1f) &
                                     0xf);
      goto LAB_007d86dc;
    }
    if (local_b80 < 7) {
      local_b50 = (char *)(long)(int)(0xfdb1ace >> ((byte)((local_b80 & 0x3fffffff) << 2) & 0x1f) &
                                     0xf);
      goto LAB_007d86dc;
    }
    if (local_ce0 == (char *)(long)in_stack_00000010[2]) {
      local_b50 = (char *)0x2;
      goto LAB_007d86dc;
    }
    if (local_ce0 == (char *)(long)in_stack_00000010[3]) {
      local_b50 = (char *)0x3;
      goto LAB_007d86dc;
    }
  }
  local_b50 = local_ce0 + 0xf;
LAB_007d86dc:
  if ((local_ce0 <= local_db0 + local_ca8) && (local_b50 != (char *)0x0)) {
    in_stack_00000010[3] = in_stack_00000010[2];
    in_stack_00000010[2] = in_stack_00000010[1];
    in_stack_00000010[1] = *in_stack_00000010;
    *in_stack_00000010 = (int)local_ce0;
    local_9e0 = local_c60;
    local_9cc = 4;
  }
  local_b20 = (uint *)(local_c58 + 0x38);
  local_b18 = in_stack_00000020;
  local_b28 = local_c80;
  local_b30 = local_ce8;
  local_b34 = (uint)local_cd0;
  local_b40 = local_b50;
  local_b44 = (uint)local_cd0 & 0xff;
  *in_stack_00000020 = (int)local_c80;
  in_stack_00000020[1] = (uint)local_ce8 | local_b44 << 0x19;
  local_a90 = (ulong)*(uint *)(local_c58 + 0x3c);
  local_a98 = (ulong)*local_b20;
  local_aa0 = (ushort *)((long)in_stack_00000020 + 0xe);
  local_aa8 = in_stack_00000020 + 2;
  local_a88 = local_b50;
  if (local_b50 < (char *)(local_a90 + 0x10)) {
    *local_aa0 = (ushort)local_b50;
    *local_aa8 = 0;
  }
  else {
    bVar1 = (byte)*local_b20;
    local_ab0 = local_b50 + (1L << (bVar1 + 2 & 0x3f)) + (-0x10 - local_a90);
    iVar4 = 0x1f;
    if ((uint)local_ab0 != 0) {
      for (; (uint)local_ab0 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_ab8 = (ulong)(iVar4 - 1U);
    local_ac0 = (ulong)((1 << (bVar1 & 0x1f)) - 1);
    local_ac8 = (ulong)local_ab0 & local_ac0;
    bVar8 = (byte)(iVar4 - 1U);
    local_ad0 = (ulong)local_ab0 >> (bVar8 & 0x3f) & 1;
    local_ad8 = local_ad0 + 2 << (bVar8 & 0x3f);
    local_ae0 = local_ab8 - local_a98;
    *local_aa0 = (short)local_ae0 * 0x400 |
                 (short)*(uint *)(local_c58 + 0x3c) + 0x10 +
                 (short)((local_ae0 + -1) * 2 + local_ad0 << (bVar1 & 0x3f)) + (short)local_ac8;
    *local_aa8 = (int)((ulong)((long)local_ab0 - local_ad8) >> (bVar1 & 0x3f));
    local_a80 = local_ab0;
  }
  iVar4 = (uint)local_ce8 + (uint)local_cd0;
  local_a60 = (ulong)iVar4;
  local_a64 = (uint)((*(ushort *)((long)in_stack_00000020 + 0xe) & 0x3ff) == 0);
  local_a70 = (ushort *)(in_stack_00000020 + 3);
  local_a58 = local_c80;
  local_a48 = local_c80;
  if (local_c80 < 6) {
    local_a3a = (ushort)local_c80;
  }
  else if (local_c80 < 0x82) {
    local_a30 = local_c80 - 2;
    local_a4c = 0x1f;
    if ((uint)local_a30 != 0) {
      for (; (uint)local_a30 >> local_a4c == 0; local_a4c = local_a4c + -1) {
      }
    }
    local_a4c = local_a4c + -1;
    local_a3a = (short)local_a4c * 2 + (short)(local_c80 - 2 >> ((byte)local_a4c & 0x3f)) + 2;
  }
  else if (local_c80 < 0x842) {
    local_a38 = local_c80 - 0x42;
    iVar3 = 0x1f;
    if ((uint)local_a38 != 0) {
      for (; (uint)local_a38 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    local_a3a = (short)iVar3 + 10;
  }
  else if (local_c80 < 0x1842) {
    local_a3a = 0x15;
  }
  else if (local_c80 < 0x5842) {
    local_a3a = 0x16;
  }
  else {
    local_a3a = 0x17;
  }
  local_a72 = local_a3a;
  if (local_a60 < 10) {
    local_a12 = (short)iVar4 - 2;
  }
  else if (local_a60 < 0x86) {
    local_a08 = local_a60 - 6;
    local_a24 = 0x1f;
    if ((uint)local_a08 != 0) {
      for (; (uint)local_a08 >> local_a24 == 0; local_a24 = local_a24 + -1) {
      }
    }
    local_a24 = local_a24 + -1;
    local_a12 = (short)local_a24 * 2 + (short)(local_a60 - 6 >> ((byte)local_a24 & 0x3f)) + 4;
  }
  else if (local_a60 < 0x846) {
    local_a10 = local_a60 - 0x46;
    iVar4 = 0x1f;
    if ((uint)local_a10 != 0) {
      for (; (uint)local_a10 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_a12 = (short)iVar4 + 0xc;
  }
  else {
    local_a12 = 0x17;
  }
  local_a74 = local_a12;
  local_9ec = local_a3a;
  local_9ee = local_a12;
  local_9f6 = local_a12 & 7 | (local_a3a & 7) << 3;
  if (((local_a64 == 0) || (7 < local_a3a)) || (0xf < local_a12)) {
    iVar4 = ((int)(uint)local_a12 >> 3) + ((int)(uint)local_a3a >> 3) * 3;
    local_9fc = iVar4 * 0x40 + 0x40 + (0x520d40U >> ((char)iVar4 * '\x02' & 0x1fU) & 0xc0);
    local_9ea = (ushort)local_9fc | local_9f6;
  }
  else {
    local_9ea = local_9f6;
    if (7 < local_a12) {
      local_9ea = local_9f6 | 0x40;
    }
  }
  *local_a70 = local_9ea;
  *in_stack_00000030 = local_c80 + *in_stack_00000030;
  local_c80 = 0;
  pcVar6 = local_c38 + 2;
  local_be8 = local_c38 + (long)local_ce8;
  local_bf0 = local_c90;
  local_dc8 = local_be8;
  if (local_c90 <= local_be8) {
    local_dc8 = local_c90;
  }
  local_d30 = pcVar6;
  if (local_ce0 < (char *)((ulong)local_ce8 >> 2)) {
    local_af0 = local_c38 + (long)local_ce8 + (long)local_ce0 * -4;
    local_dd8 = local_af0;
    if (local_af0 < pcVar6) {
      local_dd8 = pcVar6;
    }
    local_bf8 = local_dc8;
    local_c00 = local_dd8;
    if (local_dc8 < local_dd8) {
      local_de0 = local_dc8;
    }
    else {
      local_de0 = local_dd8;
    }
    local_d30 = local_de0;
    local_ae8 = pcVar6;
  }
  local_2d0 = local_c60;
  local_2d8 = local_c40;
  local_2e0 = local_c48;
  local_2e8 = local_d30;
  local_2f0 = local_dc8;
  local_a20 = local_a60;
  local_9f4 = local_a64;
  for (local_2f8 = local_d30; local_2f8 < local_2f0; local_2f8 = local_2f8 + 1) {
    local_270 = local_2d0;
    local_278 = local_2d8;
    local_280 = local_2e0;
    local_288 = local_2f8;
    local_290 = duckdb_brotli::AddrH40(*(void **)(local_2d0 + 8));
    local_298 = duckdb_brotli::HeadH40((void *)0x7d91d6);
    local_2a0 = duckdb_brotli::TinyHashH40((void *)0x7d91ef);
    local_2a8 = duckdb_brotli::BanksH40(*(void **)(local_270 + 0xc));
    local_60 = (int *)(local_278 + ((ulong)local_288 & (ulong)local_280));
    local_54 = *local_60;
    local_64 = local_54 * 0x1e35a7bd;
    local_2b0 = (ulong)(local_64 >> 0x11);
    local_2b8 = 0;
    uVar2 = *local_270;
    *local_270 = uVar2 + 1;
    local_2c0 = (long)(int)(uint)uVar2;
    local_2c8 = (long)local_288 - (ulong)local_290[local_2b0];
    local_2a0[(ulong)local_288 & 0xffff] = (uint8_t)(local_64 >> 0x11);
    if (0xffff < local_2c8) {
      local_2c8 = 0xffff;
    }
    local_2a8->slots[local_2c0].delta = (uint16_t)local_2c8;
    local_2a8->slots[local_2c0].next = local_298[local_2b0];
    local_290[local_2b0] = (uint32_t)local_288;
    local_298[local_2b0] = uVar2;
    local_50 = local_60;
  }
  in_stack_00000020 = in_stack_00000020 + 4;
  pcVar6 = local_ce8 + (long)local_c38;
  goto LAB_007d5810;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}